

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

tuple<double,_double> calcSum(TKeyWaveformF *waveform,int is0,int is1)

{
  int in_ECX;
  int in_EDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  tuple<double,_double> *in_RDI;
  _Tuple_impl<1UL,_double> extraout_XMM0_Qa;
  _Head_base<0UL,_double,_false> in_XMM1_Qa;
  tuple<double,_double> tVar1;
  value_type a0;
  int is;
  double sum2;
  double sum;
  double *in_stack_ffffffffffffffb8;
  undefined4 local_2c;
  
  for (local_2c = in_EDX; local_2c < in_ECX; local_2c = local_2c + 1) {
    std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_2c);
  }
  std::tuple<double,_double>::tuple<double_&,_double_&,_true>
            (in_RDI,in_stack_ffffffffffffffb8,(double *)0x1408b3);
  tVar1.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       in_XMM1_Qa._M_head_impl;
  tVar1.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       extraout_XMM0_Qa.super__Head_base<1UL,_double,_false>._M_head_impl;
  return (tuple<double,_double>)tVar1.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

std::tuple<double, double> calcSum(const TKeyWaveformF & waveform, int is0, int is1) {
    double sum = 0.0f;
    double sum2 = 0.0f;
    for (int is = is0; is < is1; ++is) {
        auto a0 = waveform[is];
        sum += a0;
        sum2 += a0*a0;
    }

    return std::tuple<double, double>(sum, sum2);
}